

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void plus_EBNF(Grammar *g)

{
  uint uVar1;
  Production *p;
  Rule *pRVar2;
  Elem *pEVar3;
  Elem *local_28;
  Elem *elem;
  Rule *rr;
  Production *pp;
  Grammar *g_local;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 0x10;
  pRVar2 = new_rule(g,p);
  if (g->right_recursive_BNF == 0) {
    local_28 = (g->r->elems).v[(g->r->elems).n - 1];
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = new_elem_nterm(p,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = new_elem_nterm(p,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_00140403:
        pEVar3 = new_elem_nterm(p,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_00140403;
      pEVar3 = new_elem_nterm(p,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = dup_elem(local_28,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = dup_elem(local_28,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_0014050d:
        pEVar3 = dup_elem(local_28,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_0014050d;
      pEVar3 = dup_elem(local_28,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    pEVar3 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar3;
    if (g->r->rule_priority != 0) {
      pRVar2->rule_priority = g->r->rule_priority;
      pRVar2->rule_assoc = ASSOC_NARY_LEFT;
    }
  }
  else {
    local_28 = (g->r->elems).v[(g->r->elems).n - 1];
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = dup_elem(local_28,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = dup_elem(local_28,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_001406b2:
        pEVar3 = dup_elem(local_28,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_001406b2;
      pEVar3 = dup_elem(local_28,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    pEVar3 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar3;
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = new_elem_nterm(p,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = new_elem_nterm(p,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_001407f7:
        pEVar3 = new_elem_nterm(p,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_001407f7;
      pEVar3 = new_elem_nterm(p,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    if (g->r->rule_priority != 0) {
      pRVar2->rule_priority = g->r->rule_priority;
      pRVar2->rule_assoc = ASSOC_NARY_RIGHT;
    }
  }
  if ((p->rules).v == (Rule **)0x0) {
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else if ((p->rules).v == (p->rules).e) {
    if ((p->rules).n < 3) {
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
    }
    else {
LAB_00140910:
      vec_add_internal(&p->rules,pRVar2);
    }
  }
  else {
    if (((p->rules).n & 7) == 0) goto LAB_00140910;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).v[uVar1] = pRVar2;
  }
  pRVar2 = new_rule(g,p);
  if ((pRVar2->elems).v == (Elem **)0x0) {
    (pRVar2->elems).v = (pRVar2->elems).e;
    uVar1 = (pRVar2->elems).n;
    (pRVar2->elems).n = uVar1 + 1;
    (pRVar2->elems).e[uVar1] = local_28;
  }
  else {
    if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = local_28;
        goto LAB_00140a02;
      }
    }
    else if (((pRVar2->elems).n & 7) != 0) {
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = local_28;
      goto LAB_00140a02;
    }
    vec_add_internal(&pRVar2->elems,local_28);
  }
LAB_00140a02:
  local_28->rule = pRVar2;
  if ((p->rules).v == (Rule **)0x0) {
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else {
    if ((p->rules).v == (p->rules).e) {
      if ((p->rules).n < 3) {
        uVar1 = (p->rules).n;
        (p->rules).n = uVar1 + 1;
        (p->rules).v[uVar1] = pRVar2;
        return;
      }
    }
    else if (((p->rules).n & 7) != 0) {
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
      return;
    }
    vec_add_internal(&p->rules,pRVar2);
  }
  return;
}

Assistant:

void plus_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;
  Elem *elem;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_PLUS;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    elem = last_elem(g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_LEFT;
    }
  } else {
    elem = last_elem(g->r);
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_RIGHT;
    }
  }
  vec_add(&pp->rules, rr);
  rr = new_rule(g, pp);
  vec_add(&rr->elems, elem);
  elem->rule = rr;
  vec_add(&pp->rules, rr);
}